

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::ArgMaxParameter::Clear(ArgMaxParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->out_max_val_ = false;
    *(undefined3 *)&this->field_0x19 = 0;
    this->axis_ = 0;
    this->top_k_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void ArgMaxParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ArgMaxParameter)
  if (_has_bits_[0 / 32] & 7u) {
    ::memset(&out_max_val_, 0, reinterpret_cast<char*>(&axis_) -
      reinterpret_cast<char*>(&out_max_val_) + sizeof(axis_));
    top_k_ = 1u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}